

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChShaftsLoads.h
# Opt level: O2

void __thiscall
chrono::ChShaftsTorsionSpringDamper::~ChShaftsTorsionSpringDamper(ChShaftsTorsionSpringDamper *this)

{
  ChLoadCustomMultiple::~ChLoadCustomMultiple((ChLoadCustomMultiple *)this);
  ::operator_delete(this,0x88);
  return;
}

Assistant:

class ChApi ChShaftsTorsionSpringDamper : public ChShaftsLoad {
  public:
    ChShaftsTorsionSpringDamper(std::shared_ptr<ChShaft> mbodyA,  ///< shaft A
                                std::shared_ptr<ChShaft> mbodyB,  ///< shaft B
                                const double mstiffness,          ///< torsional stiffness
                                const double mdamping             ///< torsional damping
    );

    /// "Virtual" copy constructor (covariant return type).
    virtual ChShaftsTorsionSpringDamper* Clone() const override { return new ChShaftsTorsionSpringDamper(*this); }

    /// Set torsional stiffness, es. [Nm/rad]
    void SetTorsionalStiffness(const double mstiffness) { stiffness = mstiffness; }
    double GetTorsionalStiffness() const { return stiffness; }

    /// Set torsional damping, es [Nm s/rad]
    void SetTorsionalDamping(const double mdamping) { damping = mdamping; }
    double GetTorsionalDamping() const { return damping; }

    /// Set the phase shaftA-shaftB for zero torsion of the spring (default = 0 [rad])
    void SetRestPhase(const double mphase) { rest_phase = mphase; }
    double GetRestPhase() const { return rest_phase; }

  protected:
    double stiffness;
    double damping;
    double rest_phase;

    virtual bool IsStiff() override { return true; }

    /// Implement the computation of the torque between the two shafts,
    /// given relative rotation and velocity.
    /// Torque is assumed applied to shaft B, and it's opposite to A.
    virtual void ComputeShaftShaftTorque(const double rel_rot, const double rel_rot_dt, double& result_torque) override;
}